

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::MultiNode<QString,_QCss::StyleRule>::~MultiNode
          (MultiNode<QString,_QCss::StyleRule> *this)

{
  Data *pDVar1;
  void *in_RSI;
  
  if (this->value != (MultiNodeChain<QCss::StyleRule> *)0x0) {
    MultiNodeChain<QCss::StyleRule>::free(this->value,in_RSI);
  }
  pDVar1 = (this->key).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->key).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~MultiNode()
    {
        if (value)
            value->free();
    }